

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

CBlockIndex * __thiscall ChainstateManager::GetBackgroundSyncTip(ChainstateManager *this)

{
  Chainstate *pCVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  pointer ppCVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  
  pCVar1 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if ((((pCVar1 == (Chainstate *)0x0) || (pCVar1->m_disabled != false)) ||
      (_Var2._M_head_impl =
            (this->m_ibd_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
      _Var2._M_head_impl == (Chainstate *)0x0)) ||
     (((_Var2._M_head_impl)->m_disabled != false ||
      (_Var2._M_head_impl =
            (this->m_ibd_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
      ppCVar3 = *(pointer *)((long)&(_Var2._M_head_impl)->m_chain + 8),
      ppCVar3 == *(pointer *)&((_Var2._M_head_impl)->m_chain).vChain)))) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pCVar4 = ppCVar3[0xffffffffffffffff];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(GetMutex()) {
        return BackgroundSyncInProgress() ? m_ibd_chainstate->m_chain.Tip() : nullptr;
    }